

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Logging.cpp
# Opt level: O0

double soul::Logger::log(double __x)

{
  bool bVar1;
  Message *in_RDI;
  double extraout_XMM0_Qa;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> g;
  LoggerHolder *holder;
  Message *message_local;
  
  g._M_device = &getCallbackHolder()->lock;
  std::lock_guard<std::mutex>::lock_guard(&local_20,g._M_device);
  bVar1 = std::operator!=((function<void_(const_soul::Logger::Message_&)> *)(g._M_device + 1),
                          (nullptr_t)0x0);
  if (bVar1) {
    std::function<void_(const_soul::Logger::Message_&)>::operator()
              ((function<void_(const_soul::Logger::Message_&)> *)(g._M_device + 1),in_RDI);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return extraout_XMM0_Qa;
}

Assistant:

void Logger::log (const Message& message)
{
    auto& holder = getCallbackHolder();
    std::lock_guard<std::mutex> g (holder.lock);

    if (holder.callback != nullptr)
        holder.callback (message);
}